

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::BestCastFinder::updateBestCast
          (BestCastFinder *this,Expression *curr,Index index)

{
  bool bVar1;
  mapped_type *ppEVar2;
  Expression **bestCast;
  Expression *pEStack_18;
  Index index_local;
  Expression *curr_local;
  BestCastFinder *this_local;
  
  bestCast._4_4_ = index;
  pEStack_18 = curr;
  curr_local = (Expression *)this;
  ppEVar2 = std::
            unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
            ::operator[](&this->mostCastedGets,(key_type *)((long)&bestCast + 4));
  if (*ppEVar2 == (mapped_type)0x0) {
    *ppEVar2 = pEStack_18;
  }
  else {
    bVar1 = wasm::Type::operator!=(&pEStack_18->type,&(*ppEVar2)->type);
    if ((bVar1) &&
       (bVar1 = wasm::Type::isSubType((Type)(pEStack_18->type).id,(Type)((*ppEVar2)->type).id),
       bVar1)) {
      *ppEVar2 = pEStack_18;
    }
  }
  return;
}

Assistant:

void updateBestCast(Expression* curr, Index index) {
    auto*& bestCast = mostCastedGets[index];
    if (!bestCast) {
      // This is the first.
      bestCast = curr;
      return;
    }

    // See if we are better than the current best.
    if (curr->type != bestCast->type &&
        Type::isSubType(curr->type, bestCast->type)) {
      bestCast = curr;
    }
  }